

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *this,int64_t id,TPZVec<long> *nodeindexes,
          int matind,TPZGeoMesh *mesh)

{
  TPZRegisterClassId *in_RDI;
  TPZGeoMesh *in_stack_00000008;
  int in_stack_00000014;
  TPZVec<long> *in_stack_00000018;
  int64_t in_stack_00000020;
  void **in_stack_00000028;
  TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *in_stack_00000030;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0243dc48);
  TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::TPZGeoElRefLess
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000014,in_stack_00000008);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0243d920;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0243d920;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x108));
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)in_RDI);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(id,nodeindexes,matind,mesh) {
}